

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

void __thiscall duckdb::Value::Value(Value *this,Value *other)

{
  int64_t iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  
  LogicalType::LogicalType(&this->type_,&other->type_);
  this->is_null = other->is_null;
  iVar1 = (other->value_).hugeint.upper;
  (this->value_).bigint = (other->value_).bigint;
  (this->value_).hugeint.upper = iVar1;
  (this->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar2 = (other->value_info_).internal.
           super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var3 = (other->value_info_).internal.
           super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (other->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  (this->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var3;
  (other->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  return;
}

Assistant:

Value::Value(Value &&other) noexcept
    : type_(std::move(other.type_)), is_null(other.is_null), value_(other.value_),
      value_info_(std::move(other.value_info_)) {
}